

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::RegisterDataSourceRequest::ParseFromArray
          (RegisterDataSourceRequest *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false> _Var2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  uint8_t cur_byte_1;
  ulong *puVar9;
  uint uVar10;
  uint8_t cur_byte_2;
  ulong *puVar11;
  ulong uVar12;
  uint8_t cur_byte;
  ulong *puVar13;
  Field local_40;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  local_40.int_value_ = 0;
LAB_0025914f:
  if (puVar8 <= raw) goto switchD_0025919b_caseD_3;
  bVar1 = (byte)*raw;
  uVar7 = (ulong)bVar1;
  puVar11 = (ulong *)((long)raw + 1);
  if ((char)bVar1 < '\0') {
    uVar7 = (ulong)(bVar1 & 0x7f);
    lVar6 = 7;
    do {
      if ((puVar8 <= puVar11) || (0x38 < lVar6 - 7U)) goto switchD_0025919b_caseD_3;
      uVar12 = *puVar11;
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar7 = uVar7 | (ulong)((byte)uVar12 & 0x7f) << ((byte)lVar6 & 0x3f);
      lVar6 = lVar6 + 7;
    } while ((char)(byte)uVar12 < '\0');
  }
  uVar10 = (uint)(uVar7 >> 3);
  if ((uVar10 == 0) || (puVar8 <= puVar11)) goto switchD_0025919b_caseD_3;
  switch((uint)uVar7 & 7) {
  case 0:
    uVar12 = 0;
    uVar5 = 0;
    while( true ) {
      puVar13 = (ulong *)((long)puVar11 + 1);
      uVar12 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar5 & 0x3f) | uVar12;
      if (-1 < (char)(byte)*puVar11) break;
      if ((puVar8 <= puVar13) || (bVar3 = 0x38 < uVar5, uVar5 = uVar5 + 7, puVar11 = puVar13, bVar3)
         ) goto switchD_0025919b_caseD_3;
    }
    uVar5 = uVar12 & 0xffffffff00000000;
LAB_00259270:
    uVar4 = 0;
LAB_00259272:
    raw = puVar13;
    if ((uVar10 < 0x10000) && (uVar4 < 0x10000000)) {
      local_40.int_value_ = uVar5 | uVar12 & 0xffffffff;
      uVar7 = uVar4 | (uVar7 >> 3) << 0x20 | (uVar7 & 7) << 0x30;
LAB_00259310:
LAB_00259320:
      local_40.size_ = (uint32_t)uVar7;
      local_40.type_ = (uint8_t)(uVar7 >> 0x30);
      local_40.id_ = (uint16_t)(uVar7 >> 0x20);
      puVar11 = puVar13;
      if (local_40.id_ == 1) {
        *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
             (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
        _Var2._M_head_impl =
             (this->data_source_descriptor_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
             .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>.
             _M_head_impl;
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                  (_Var2._M_head_impl,local_40.int_value_,uVar7 & 0xffffffff);
      }
      else {
        if ((uVar7 & 0xffff00000000) == 0) {
          return puVar8 == puVar13;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_40,&this->unknown_fields_);
      }
LAB_002593d1:
      if (puVar8 <= puVar11) goto switchD_0025941a_caseD_3;
      bVar1 = (byte)*puVar11;
      uVar7 = (ulong)(uint)bVar1;
      puVar9 = (ulong *)((long)puVar11 + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar8 <= puVar9) || (0x38 < lVar6 - 7U)) goto switchD_0025941a_caseD_3;
          uVar12 = *puVar9;
          puVar9 = (ulong *)((long)puVar9 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar12 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar12 < '\0');
      }
      uVar10 = (uint)(uVar7 >> 3);
      if ((uVar10 == 0) || (puVar8 <= puVar9)) goto switchD_0025941a_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar12 = 0;
        uVar5 = 0;
        while( true ) {
          puVar13 = (ulong *)((long)puVar9 + 1);
          uVar12 = (ulong)((byte)*puVar9 & 0x7f) << ((byte)uVar5 & 0x3f) | uVar12;
          if (-1 < (char)(byte)*puVar9) break;
          if ((puVar8 <= puVar13) ||
             (bVar3 = 0x38 < uVar5, uVar5 = uVar5 + 7, puVar9 = puVar13, bVar3))
          goto switchD_0025941a_caseD_3;
        }
        local_40.int_value_ = uVar12 & 0xffffffff00000000;
LAB_002594ec:
        uVar5 = 0;
LAB_002594ee:
        puVar11 = puVar13;
        if ((0xffff < uVar10) || (0xfffffff < uVar5)) goto LAB_002593d1;
        local_40.int_value_ = local_40.int_value_ | uVar12 & 0xffffffff;
        uVar7 = uVar5 | (uVar7 >> 3) << 0x20 | (uVar7 & 7) << 0x30;
        goto LAB_00259320;
      case 1:
        puVar13 = puVar9 + 1;
        if (puVar13 <= puVar8) {
          uVar12 = *puVar9;
          local_40.int_value_ = uVar12 & 0xffffffff00000000;
          goto LAB_002594ec;
        }
        break;
      case 2:
        puVar9 = (ulong *)((long)puVar9 + 1);
        uVar5 = 0;
        uVar12 = 0;
        puVar13 = puVar9;
        while (uVar5 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar12 & 0x3f) |
                       uVar5, (char)*(byte *)((long)puVar13 + -1) < '\0') {
          if (puVar8 <= puVar13) goto switchD_0025941a_caseD_3;
          puVar13 = (ulong *)((long)puVar13 + 1);
          puVar9 = (ulong *)((long)puVar9 + 1);
          bVar3 = 0x38 < uVar12;
          uVar12 = uVar12 + 7;
          if (bVar3) goto switchD_0025941a_caseD_3;
        }
        if (uVar5 <= (ulong)((long)puVar8 - (long)puVar9)) {
          local_40.int_value_ = (ulong)puVar9 & 0xffffffff00000000;
          puVar13 = (ulong *)((long)puVar13 + uVar5);
          uVar12 = (ulong)puVar9 & 0xffffffff;
          goto LAB_002594ee;
        }
        break;
      case 5:
        puVar13 = (ulong *)((long)puVar9 + 4);
        if (puVar13 <= puVar8) {
          uVar12 = (ulong)(uint)*puVar9;
          local_40.int_value_ = 0;
          goto LAB_002594ec;
        }
      }
switchD_0025941a_caseD_3:
      local_40.int_value_ = 0;
      uVar7 = 0;
      puVar13 = puVar11;
      goto LAB_00259320;
    }
    goto LAB_0025914f;
  case 1:
    puVar13 = puVar11 + 1;
    if (puVar13 <= puVar8) {
      uVar12 = *puVar11;
      uVar5 = uVar12 & 0xffffffff00000000;
      goto LAB_00259270;
    }
    break;
  case 2:
    puVar11 = (ulong *)((long)puVar11 + 1);
    uVar4 = 0;
    uVar12 = 0;
    puVar13 = puVar11;
    while (uVar4 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar12 & 0x3f) | uVar4,
          (char)*(byte *)((long)puVar13 + -1) < '\0') {
      if (puVar8 <= puVar13) goto switchD_0025919b_caseD_3;
      puVar13 = (ulong *)((long)puVar13 + 1);
      puVar11 = (ulong *)((long)puVar11 + 1);
      bVar3 = 0x38 < uVar12;
      uVar12 = uVar12 + 7;
      if (bVar3) goto switchD_0025919b_caseD_3;
    }
    if (uVar4 <= (ulong)((long)puVar8 - (long)puVar11)) {
      uVar5 = (ulong)puVar11 & 0xffffffff00000000;
      puVar13 = (ulong *)((long)puVar13 + uVar4);
      uVar12 = (ulong)puVar11 & 0xffffffff;
      goto LAB_00259272;
    }
    break;
  case 5:
    puVar13 = (ulong *)((long)puVar11 + 4);
    if (puVar13 <= puVar8) {
      uVar12 = (ulong)(uint)*puVar11;
      uVar5 = 0;
      goto LAB_00259270;
    }
  }
switchD_0025919b_caseD_3:
  uVar7 = 0;
  puVar13 = (ulong *)raw;
  goto LAB_00259310;
}

Assistant:

bool RegisterDataSourceRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* data_source_descriptor */:
        (*data_source_descriptor_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}